

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateStaticVariables
          (ImmutableMessageLiteGenerator *this,Printer *printer,int *bytecode_estimate)

{
  Descriptor *pDVar1;
  long lVar2;
  long lVar3;
  ImmutableMessageLiteGenerator local_70;
  
  pDVar1 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar1 + 0x48)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      ImmutableMessageLiteGenerator
                (&local_70,(Descriptor *)(*(long *)(pDVar1 + 0x50) + lVar3),this->context_);
      GenerateStaticVariables(&local_70,printer,bytecode_estimate);
      local_70.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&PTR__ImmutableMessageLiteGenerator_00420710;
      FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
      ~FieldGeneratorMap(&local_70.field_generators_);
      MessageGenerator::~MessageGenerator(&local_70.super_MessageGenerator);
      lVar2 = lVar2 + 1;
      pDVar1 = (this->super_MessageGenerator).descriptor_;
      lVar3 = lVar3 + 0xa8;
    } while (lVar2 < *(int *)(pDVar1 + 0x48));
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateStaticVariables(
    io::Printer* printer, int* bytecode_estimate) {
  // Generate static members for all nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // TODO(kenton):  Reuse MessageGenerator objects?
    ImmutableMessageLiteGenerator(descriptor_->nested_type(i), context_)
        .GenerateStaticVariables(printer, bytecode_estimate);
  }
}